

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFV.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
Storage::MassStorage::HFV::get_block
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,HFV *this,
          size_t address)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  ssize_t sVar4;
  size_t sVar5;
  stat *psVar6;
  void *__buf;
  size_t __nbytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88 [2];
  undefined1 local_58 [32];
  long file_offset;
  ssize_t source_address;
  _Self local_28;
  iterator written;
  size_t address_local;
  HFV *this_local;
  
  written._M_node = (_Base_ptr)address;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
       ::find(&this->writes_,(key_type_conflict1 *)&written);
  source_address =
       (ssize_t)std::
                map<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::end(&this->writes_);
  bVar2 = std::operator!=(&local_28,(_Self *)&source_address);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator->(&local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (__return_storage_ptr__,&ppVar3->second);
  }
  else {
    sVar4 = Encodings::Apple::
            PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
            to_source_address(&this->mapper_,(size_t)written._M_node);
    file_offset = sVar4;
    if (-1 < sVar4) {
      sVar5 = get_block_size(this);
      psVar6 = FileHolder::stats(&this->file_);
      if (sVar4 * sVar5 < (ulong)psVar6->st_size) {
        sVar5 = get_block_size(this);
        local_58._24_8_ = sVar5 * file_offset;
        __nbytes = file_offset;
        FileHolder::seek(&this->file_,local_58._24_8_,0);
        lVar1 = file_offset;
        __buf = (void *)get_block_size(this);
        FileHolder::read((FileHolder *)local_58,(int)&this->file_,__buf,__nbytes);
        Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
        convert_source_block
                  (__return_storage_ptr__,&this->mapper_,lVar1,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
        return __return_storage_ptr__;
      }
    }
    lVar1 = file_offset;
    local_88[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_88);
    Encodings::Apple::PartitionMap<Storage::MassStorage::Encodings::Macintosh::VolumeProvider>::
    convert_source_block(__return_storage_ptr__,&this->mapper_,lVar1,local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> HFV::get_block(size_t address) {
	const auto written = writes_.find(address);
	if(written != writes_.end()) return written->second;

	const auto source_address = mapper_.to_source_address(address);
	if(source_address >= 0 && size_t(source_address)*get_block_size() < size_t(file_.stats().st_size)) {
		const long file_offset = long(get_block_size()) * long(source_address);
		file_.seek(file_offset, SEEK_SET);
		return mapper_.convert_source_block(source_address, file_.read(get_block_size()));
	} else {
		return mapper_.convert_source_block(source_address);
	}
}